

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O1

JavascriptDate *
Js::JavascriptDate::NewInstanceAsConstructor
          (Arguments *args,ScriptContext *scriptContext,bool forceCurrentDate)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  JavascriptDate *pJVar8;
  JavascriptDate *pJVar9;
  Var pvVar10;
  JavascriptString *pParseString;
  uint64 uVar11;
  uint64 uVar12;
  uint i;
  ulong uVar13;
  double dVar14;
  double local_88;
  double values [7];
  double local_38;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x6a,"(scriptContext)","scriptContext");
    if (!bVar3) goto LAB_00bc3cb1;
    *puVar7 = 0;
  }
  pJVar8 = JavascriptLibrary::CreateDate((scriptContext->super_ScriptContextBase).javascriptLibrary)
  ;
  if (!forceCurrentDate) {
    uVar6 = *(uint *)&args->Info & 0xffffff;
    if (uVar6 == 2) {
      pvVar10 = Arguments::operator[](args,1);
      bVar3 = VarIs<Js::JavascriptDate>(pvVar10);
      pvVar10 = Arguments::operator[](args,1);
      if (bVar3) {
        pJVar9 = VarTo<Js::JavascriptDate>(pvVar10);
        local_38 = (pJVar9->m_date).m_tvUtc;
      }
      else {
        pvVar10 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>(pvVar10,scriptContext);
        bVar3 = VarIs<Js::JavascriptString>(pvVar10);
        if (bVar3) {
          pParseString = VarTo<Js::JavascriptString>(pvVar10);
          local_38 = DateImplementation::UtcTimeFromStr(scriptContext,pParseString);
        }
        else {
          if (((ulong)pvVar10 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00bc3cb1;
            *puVar7 = 0;
          }
          if (((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
            local_38 = (double)(int)pvVar10;
          }
          else if ((ulong)pvVar10 >> 0x32 == 0) {
            local_38 = JavascriptConversion::ToNumber_Full(pvVar10,scriptContext);
          }
          else {
            local_38 = (double)((ulong)pvVar10 ^ 0xfffc000000000000);
          }
        }
      }
      uVar11 = NumberUtilities::ToSpecial(local_38);
      bVar3 = NumberUtilities::IsNan(local_38);
      if (((bVar3) && (uVar12 = NumberUtilities::ToSpecial(local_38), uVar12 != 0xfff8000000000000))
         && (uVar12 = NumberUtilities::ToSpecial(local_38), uVar12 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar3) {
LAB_00bc3cb1:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      dVar14 = TimeClip((Var)(uVar11 ^ 0xfffc000000000000));
      goto LAB_00bc37f8;
    }
    if (uVar6 != 1) {
      bVar3 = ((ulong)args->Info & 0xfffffe) == 0;
      if (!bVar3) {
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar13 = 0;
        values[6] = (double)args;
        do {
          uVar1 = uVar13 + 1;
          pvVar10 = Arguments::operator[](args,(int)uVar1);
          if (((ulong)pvVar10 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar4) goto LAB_00bc3cb1;
            *puVar7 = 0;
          }
          args = (Arguments *)values[6];
          if (((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
            dVar14 = (double)(int)pvVar10;
          }
          else if (pvVar10 < (Var)0x4000000000000) {
            dVar14 = JavascriptConversion::ToNumber_Full(pvVar10,scriptContext);
          }
          else {
            dVar14 = (double)((ulong)pvVar10 ^ 0xfffc000000000000);
          }
          values[uVar13 - 1] = dVar14;
          bVar4 = NumberUtilities::IsNan(dVar14);
          if (bVar4) {
LAB_00bc39b4:
            DateImplementation::SetTvUtc(&pJVar8->m_date,dVar14);
            bVar4 = false;
          }
          else {
            bVar5 = NumberUtilities::IsFinite(dVar14);
            bVar4 = true;
            if (!bVar5) goto LAB_00bc39b4;
          }
        } while ((bVar4) &&
                (bVar4 = (ulong)((uint)args->Info & 0xffffff) <= uVar13 + 2,
                bVar3 = 6 < uVar1 || bVar4, uVar13 = uVar1, 6 >= uVar1 && !bVar4));
      }
      if (!bVar3) {
        return pJVar8;
      }
      uVar13 = 0;
      do {
        if (uVar13 < (*(uint *)&args->Info & 0xffffff) - 1) {
          dVar14 = JavascriptConversion::ToInteger(values[uVar13 - 1]);
        }
        else {
          dVar14 = 1.0;
          if (uVar13 != 2) {
            dVar14 = 0.0;
          }
        }
        values[uVar13 - 1] = dVar14;
        uVar13 = uVar13 + 1;
      } while (uVar13 != 7);
      if ((local_88 < 100.0) && (0.0 <= local_88)) {
        local_88 = local_88 + 1900.0;
      }
      dVar14 = DateUtilities::TvFromDate
                         (local_88,values[0],values[1] + -1.0,
                          values[4] * 1000.0 + values[2] * 3600000.0 + values[3] * 60000.0 +
                          values[5]);
      DateImplementation::SetTvLcl(&pJVar8->m_date,dVar14,scriptContext);
      return pJVar8;
    }
  }
  local_88 = DateImplementation::NowFromHiResTimer(scriptContext);
  if (scriptContext->TTDShouldPerformReplayAction == true) {
    TTD::EventLog::ReplayDateTimeEvent(scriptContext->threadContext->TTDLog,&local_88);
    dVar14 = local_88;
  }
  else {
    dVar14 = local_88;
    if (scriptContext->TTDShouldPerformRecordAction == true) {
      TTD::EventLog::RecordDateTimeEvent(scriptContext->threadContext->TTDLog,local_88);
      dVar14 = local_88;
    }
  }
LAB_00bc37f8:
  DateImplementation::SetTvUtc(&pJVar8->m_date,dVar14);
  return pJVar8;
}

Assistant:

JavascriptDate* JavascriptDate::NewInstanceAsConstructor(Js::Arguments args, ScriptContext* scriptContext, bool forceCurrentDate)
    {
        Assert(scriptContext);

        double timeValue = 0;
        JavascriptDate* pDate;

        pDate = scriptContext->GetLibrary()->CreateDate();


        //
        // [15.9.3.3]
        // No arguments passed. Return the current time
        //
        if (forceCurrentDate || args.Info.Count == 1)
        {
            double resTime = DateImplementation::NowFromHiResTimer(scriptContext);

#if ENABLE_TTD
            if(scriptContext->ShouldPerformReplayAction())
            {
                scriptContext->GetThreadContext()->TTDLog->ReplayDateTimeEvent(&resTime);
            }
            else if(scriptContext->ShouldPerformRecordAction())
            {
                scriptContext->GetThreadContext()->TTDLog->RecordDateTimeEvent(resTime);
            }
            else
            {
                ;
            }
#endif

            pDate->m_date.SetTvUtc(resTime);
            return pDate;
        }

        //
        // [15.9.3.2]
        // One argument given
        // If string parse it and use that timeValue
        // Else convert to Number and use that as timeValue
        //
        if (args.Info.Count == 2)
        {
            if (VarIs<JavascriptDate>(args[1]))
            {
                JavascriptDate* dateObject = VarTo<JavascriptDate>(args[1]);
                timeValue = ((dateObject)->m_date).m_tvUtc;
            }
            else
            {
                Var value = JavascriptConversion::ToPrimitive<Js::JavascriptHint::None>(args[1], scriptContext);
                if (VarIs<JavascriptString>(value))
                {
                    timeValue = ParseHelper(scriptContext, VarTo<JavascriptString>(value));
                }
                else
                {
                    timeValue = JavascriptConversion::ToNumber(value, scriptContext);
                }
            }
            
            timeValue = TimeClip(JavascriptNumber::New(timeValue, scriptContext));

            pDate->m_date.SetTvUtc(timeValue);
            return pDate;
        }

        //
        // [15.9.3.1]
        // Date called with two to seven arguments
        //

        const int parameterCount = 7;
        double values[parameterCount];

        for (uint i=1; i < args.Info.Count && i < parameterCount+1; i++)
        {
            double curr = JavascriptConversion::ToNumber(args[i], scriptContext);
            values[i-1] = curr;
            if (JavascriptNumber::IsNan(curr) || !NumberUtilities::IsFinite(curr))
            {
                pDate->m_date.SetTvUtc(curr);
                return pDate;
            }
        }

        for (uint i=0; i < parameterCount; i++)
        {
            if ( i >= args.Info.Count-1 )
            {
                values[i] = ( i == 2 );
                continue;
            }
            // MakeTime (ES5 15.9.1.11) && MakeDay (ES5 15.9.1.12) always
            // call ToInteger (which is same as JavascriptConversion::ToInteger) on arguments.
            // All are finite (not Inf or Nan) as we check them explicitly in the previous loop.
            // +-0 & +0 are same in this context.
#pragma prefast(suppress:6001, "value index i < args.Info.Count - 1 are initialized")
            values[i] = JavascriptConversion::ToInteger(values[i]);
        }

        // adjust the year
        if (values[0] < 100 && values[0] >= 0)
            values[0] += 1900;

        // Get the local time value.
        timeValue = DateImplementation::TvFromDate(values[0], values[1], values[2] - 1,
            values[3] * 3600000 + values[4] * 60000 + values[5] * 1000 + values[6]);

        // Set the time.
        pDate->m_date.SetTvLcl(timeValue, scriptContext);

        return pDate;
    }